

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O2

void __thiscall
asio::detail::
reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
::reactive_socket_accept_op_base
          (reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
           *this,error_code *success_ec,socket_type socket,state_type state,
          basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *peer,tcp *protocol,
          endpoint *peer_endpoint,func_type complete_func)

{
  error_category *peVar1;
  undefined4 uVar2;
  size_t sVar3;
  
  (this->super_reactor_op).super_operation.next_ = (scheduler_operation *)0x0;
  (this->super_reactor_op).super_operation.func_ = complete_func;
  (this->super_reactor_op).super_operation.task_result_ = 0;
  uVar2 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->super_reactor_op).ec_._M_value = success_ec->_M_value;
  *(undefined4 *)&(this->super_reactor_op).ec_.field_0x4 = uVar2;
  (this->super_reactor_op).ec_._M_cat = peVar1;
  (this->super_reactor_op).bytes_transferred_ = 0;
  (this->super_reactor_op).perform_func_ = do_perform;
  this->socket_ = socket;
  this->state_ = state;
  (this->new_socket_).socket_ = -1;
  this->peer_ = peer;
  (this->protocol_).family_ = protocol->family_;
  this->peer_endpoint_ = peer_endpoint;
  sVar3 = 0x1c;
  if (peer_endpoint == (endpoint *)0x0) {
    sVar3 = 0;
  }
  this->addrlen_ = sVar3;
  return;
}

Assistant:

reactive_socket_accept_op_base(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state, Socket& peer,
      const Protocol& protocol, typename Protocol::endpoint* peer_endpoint,
      func_type complete_func)
    : reactor_op(success_ec,
        &reactive_socket_accept_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      peer_(peer),
      protocol_(protocol),
      peer_endpoint_(peer_endpoint),
      addrlen_(peer_endpoint ? peer_endpoint->capacity() : 0)
  {
  }